

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow_conflict *window)

{
  ImRect IVar1;
  ImGuiContext_conflict *pIVar2;
  ImGuiPlatformMonitor *pIVar3;
  float fVar4;
  float local_64;
  float local_5c;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 padding;
  ImVec2 local_40;
  ImGuiPlatformMonitor *monitor;
  ImGuiContext_conflict *g;
  ImGuiWindow_conflict *window_local;
  ImRect r_screen;
  
  pIVar2 = GImGui;
  ImRect::ImRect((ImRect *)&window_local);
  if (window->ViewportAllowPlatformMonitorExtend < 0) {
    _padding = ImGuiViewportP::GetMainRect((ImGuiViewportP *)window->Viewport);
    window_local = (ImGuiWindow_conflict *)padding;
    r_screen.Min = local_40;
  }
  else {
    pIVar3 = ImVector<ImGuiPlatformMonitor>::operator[]
                       (&(pIVar2->PlatformIO).Monitors,window->ViewportAllowPlatformMonitorExtend);
    window_local = *(ImGuiWindow_conflict **)&pIVar3->WorkPos;
    r_screen.Min = operator+(&pIVar3->WorkPos,&pIVar3->WorkSize);
  }
  local_50 = (pIVar2->Style).DisplaySafeAreaPadding;
  fVar4 = ImRect::GetWidth((ImRect *)&window_local);
  if (fVar4 <= local_50.x * 2.0) {
    local_5c = 0.0;
  }
  else {
    local_5c = -local_50.x;
  }
  fVar4 = ImRect::GetHeight((ImRect *)&window_local);
  if (fVar4 <= local_50.y * 2.0) {
    local_64 = 0.0;
  }
  else {
    local_64 = -local_50.y;
  }
  ImVec2::ImVec2(&local_58,local_5c,local_64);
  ImRect::Expand((ImRect *)&window_local,&local_58);
  IVar1.Max = r_screen.Min;
  IVar1.Min = (ImVec2)window_local;
  return IVar1;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen = window->Viewport->GetMainRect();
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}